

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZone::getCanonicalID
          (UnicodeString *id,UnicodeString *canonicalID,UBool *isSystemID,UErrorCode *status)

{
  ushort uVar1;
  int8_t iVar2;
  ushort uVar3;
  ConstChar16Ptr local_38;
  UChar *local_30;
  
  uVar1 = (canonicalID->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (canonicalID->fUnion).fStackFields.fLengthAndFlags = uVar3;
  *isSystemID = '\0';
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_38.p_ = L"Etc/Unknown";
    iVar2 = UnicodeString::compare(id,&local_38,0xb);
    local_30 = local_38.p_;
    if (iVar2 == '\0') {
      UnicodeString::fastCopyFrom(canonicalID,id);
      *isSystemID = '\0';
    }
    else {
      ZoneMeta::getCanonicalCLDRID(id,canonicalID,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *isSystemID = '\x01';
      }
      else {
        *status = U_ZERO_ERROR;
        getCustomID(id,canonicalID,status);
      }
    }
  }
  return canonicalID;
}

Assistant:

UnicodeString&
TimeZone::getCanonicalID(const UnicodeString& id, UnicodeString& canonicalID, UBool& isSystemID,
                         UErrorCode& status)
{
    canonicalID.remove();
    isSystemID = FALSE;
    if (U_FAILURE(status)) {
        return canonicalID;
    }
    if (id.compare(UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH) == 0) {
        // special case - Etc/Unknown is a canonical ID, but not system ID
        canonicalID.fastCopyFrom(id);
        isSystemID = FALSE;
    } else {
        ZoneMeta::getCanonicalCLDRID(id, canonicalID, status);
        if (U_SUCCESS(status)) {
            isSystemID = TRUE;
        } else {
            // Not a system ID
            status = U_ZERO_ERROR;
            getCustomID(id, canonicalID, status);
        }
    }
    return canonicalID;
}